

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idastar.hpp
# Opt level: O1

bool __thiscall Idastar<Tiles>::dfs(Idastar<Tiles> *this,State *n,int cost,int pop)

{
  pointer *ppSVar1;
  size_t *psVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  iterator iVar6;
  Tiles *pTVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  
  iVar11 = n->h + cost;
  if (this->bound < iVar11 || n->h != '\0') {
    if (this->bound < iVar11) {
      if (this->minoob < 0 || iVar11 < this->minoob) {
        this->minoob = iVar11;
      }
      bVar10 = false;
    }
    else {
      psVar2 = &(this->super_SearchAlg<Tiles>).expd;
      *psVar2 = *psVar2 + 1;
      uVar13 = (ulong)*(int *)((this->super_SearchAlg<Tiles>).dom + (long)n->blank * 0x14 + 0x4440);
      bVar10 = 0 < (long)uVar13;
      if (0 < (long)uVar13) {
        uVar12 = 0;
        do {
          pTVar7 = (this->super_SearchAlg<Tiles>).dom;
          cVar3 = n->blank;
          lVar14 = (long)cVar3;
          iVar11 = *(int *)(pTVar7 + uVar12 * 4 + lVar14 * 0x14 + 0x4444);
          bVar10 = false;
          if (iVar11 != pop) {
            psVar2 = &(this->super_SearchAlg<Tiles>).gend;
            *psVar2 = *psVar2 + 1;
            cVar4 = n->h;
            cVar5 = n->tiles[iVar11];
            n->tiles[lVar14] = cVar5;
            n->h = n->h + (char)pTVar7[(long)n->blank * 4 +
                                       (long)cVar5 * 0x400 + (long)iVar11 * 0x40 + 0x440];
            n->blank = (char)iVar11;
            bVar9 = dfs(this,n,cost + 1,(int)cVar3);
            n->h = cVar4;
            n->tiles[n->blank] = n->tiles[lVar14];
            n->blank = cVar3;
            bVar10 = false;
            if (bVar9) {
              iVar6._M_current =
                   (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Tiles::State,std::allocator<Tiles::State>>::
                _M_realloc_insert<Tiles::State_const&>
                          ((vector<Tiles::State,std::allocator<Tiles::State>> *)&this->path,iVar6,n)
                ;
              }
              else {
                cVar3 = n->h;
                (iVar6._M_current)->blank = n->blank;
                (iVar6._M_current)->h = cVar3;
                uVar8 = *(undefined8 *)(n->tiles + 8);
                *(undefined8 *)(iVar6._M_current)->tiles = *(undefined8 *)n->tiles;
                *(undefined8 *)((iVar6._M_current)->tiles + 8) = uVar8;
                ppSVar1 = &(this->path).
                           super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + 1;
              }
              bVar10 = true;
            }
          }
          if (bVar10) goto LAB_001066d8;
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
        bVar10 = uVar12 < uVar13;
      }
    }
  }
  else {
    iVar6._M_current =
         (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Tiles::State,std::allocator<Tiles::State>>::_M_realloc_insert<Tiles::State_const&>
                ((vector<Tiles::State,std::allocator<Tiles::State>> *)&this->path,iVar6,n);
    }
    else {
      cVar3 = n->h;
      (iVar6._M_current)->blank = n->blank;
      (iVar6._M_current)->h = cVar3;
      uVar8 = *(undefined8 *)(n->tiles + 8);
      *(undefined8 *)(iVar6._M_current)->tiles = *(undefined8 *)n->tiles;
      *(undefined8 *)((iVar6._M_current)->tiles + 8) = uVar8;
      ppSVar1 = &(this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
LAB_001066d8:
    bVar10 = true;
  }
  return bVar10;
}

Assistant:

bool dfs(typename D::State &n,  int cost, int pop) {
		int f = cost + this->dom.h(n);

		if (f <= bound && this->dom.isgoal(n)) {
			path.push_back(n);
			return true;
		}

		if (f > bound) {
			if (minoob < 0 || f < minoob)
				minoob = f;
			return false;
		}

		this->expd++;
		int nops = this->dom.nops(n);
		for (int i = 0; i < nops; i++) {
			int op = this->dom.nthop(n, i);
			if (op == pop)
				continue;

			this->gend++;
			Edge<D> e = this->dom.apply(n, op);
			bool goal = dfs(n, e.cost + cost, e.pop);
			this->dom.undo(n, e);
			if (goal) {
				path.push_back(n);
				return true;
			}
		}

		return false;
	}